

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

double png_pow10(int power)

{
  bool bVar1;
  double local_28;
  double mult;
  double d;
  int recip;
  int power_local;
  
  bVar1 = false;
  mult = 1.0;
  d._4_4_ = power;
  if (power < 0) {
    if (power < -0x133) {
      return 0.0;
    }
    bVar1 = true;
    d._4_4_ = -power;
  }
  if (0 < (int)d._4_4_) {
    local_28 = 10.0;
    do {
      if ((d._4_4_ & 1) != 0) {
        mult = local_28 * mult;
      }
      local_28 = local_28 * local_28;
      d._4_4_ = (int)d._4_4_ >> 1;
    } while (0 < (int)d._4_4_);
    if (bVar1) {
      mult = 1.0 / mult;
    }
  }
  return mult;
}

Assistant:

static double
png_pow10(int power)
{
   int recip = 0;
   double d = 1;

   /* Handle negative exponent with a reciprocal at the end because
    * 10 is exact whereas .1 is inexact in base 2
    */
   if (power < 0)
   {
      if (power < DBL_MIN_10_EXP) return 0;
      recip = 1; power = -power;
   }

   if (power > 0)
   {
      /* Decompose power bitwise. */
      double mult = 10;
      do
      {
         if (power & 1) d *= mult;
         mult *= mult;
         power >>= 1;
      }
      while (power > 0);

      if (recip != 0) d = 1/d;
   }
   /* else power is 0 and d is 1 */

   return d;
}